

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O1

void __thiscall
rsg::BinaryOp<7,_(rsg::Associativity)0>::BinaryOp
          (BinaryOp<7,_(rsg::Associativity)0> *this,Type operatorToken)

{
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__BinaryOp_007a0138;
  this->m_operator = operatorToken;
  (this->m_type).m_baseType = TYPE_VOID;
  (this->m_type).m_precision = PRECISION_NONE;
  (this->m_type).m_typeName._M_dataplus._M_p = (pointer)&(this->m_type).m_typeName.field_2;
  (this->m_type).m_typeName._M_string_length = 0;
  (this->m_type).m_typeName.field_2._M_local_buf[0] = '\0';
  (this->m_type).m_numElements = 0;
  (this->m_type).m_elementType = (VariableType *)0x0;
  (this->m_type).m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_type).m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_type).m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ValueRange::ValueRange(&this->m_leftValueRange,&this->m_type);
  ValueRange::ValueRange(&this->m_rightValueRange,&this->m_type);
  this->m_leftValueExpr = (Expression *)0x0;
  this->m_rightValueExpr = (Expression *)0x0;
  return;
}

Assistant:

BinaryOp<Precedence, Assoc>::BinaryOp (Token::Type operatorToken)
	: m_operator		(operatorToken)
	, m_leftValueRange	(m_type)
	, m_rightValueRange	(m_type)
	, m_leftValueExpr	(DE_NULL)
	, m_rightValueExpr	(DE_NULL)
{
}